

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

ModelPtr __thiscall libcellml::Importer::flattenModel(Importer *this,ModelPtr *model)

{
  IssueImpl *pIVar1;
  bool bVar2;
  LoggerImpl *pLVar3;
  ImporterImpl *this_00;
  UnitsPtr *pUVar4;
  size_t sVar5;
  int in_ECX;
  ModelPtr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ComponentPtr *in_R8;
  UnitsPtr *units;
  ulong componentIndex;
  ModelPtr MVar7;
  allocator<char> local_69;
  IssuePtr issue;
  UnitsPtr u;
  
  pLVar3 = Logger::pFunc((Logger *)model);
  Logger::LoggerImpl::removeAllIssues(pLVar3);
  (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
  (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
  if ((in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,INVALID_ARGUMENT);
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&u,"The model is null.",&local_69);
    Issue::IssueImpl::setDescription(pIVar1,(string *)&u);
    std::__cxx11::string::~string((string *)&u);
    pLVar3 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar3,&issue);
  }
  else {
    this_00 = (ImporterImpl *)Logger::pFunc((Logger *)model);
    bVar2 = ImporterImpl::hasImportIssues(this_00,in_RDX);
    _Var6._M_pi = extraout_RDX;
    if (bVar2) goto LAB_001f20be;
    bVar2 = Model::isDefined((in_RDX->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    if (bVar2) {
      Model::clone((Model *)&u,
                   (__fn *)(in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,__child_stack,in_ECX,in_R8);
      std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&u);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      while( true ) {
        bVar2 = Model::hasImports((Model *)(this->super_Logger)._vptr_Logger);
        if (!bVar2) break;
        units = (UnitsPtr *)0x0;
        while( true ) {
          pUVar4 = (UnitsPtr *)Model::unitsCount((Model *)(this->super_Logger)._vptr_Logger);
          if (pUVar4 <= units) break;
          Model::units((Model *)&u,(size_t)(this->super_Logger)._vptr_Logger);
          bVar2 = ImportedEntity::isImport
                            (&(u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ImportedEntity);
          if (bVar2) {
            issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            flattenUnitsImports((libcellml *)this,(ModelPtr *)&u,units,(size_t)&issue,in_R8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          units = (UnitsPtr *)
                  ((long)&(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
        }
        componentIndex = 0;
        while( true ) {
          sVar5 = ComponentEntity::componentCount
                            ((ComponentEntity *)(this->super_Logger)._vptr_Logger);
          if (sVar5 <= componentIndex) break;
          ComponentEntity::component
                    ((ComponentEntity *)&u,(size_t)(this->super_Logger)._vptr_Logger);
          std::__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libcellml::Model,void>
                    ((__shared_ptr<libcellml::ComponentEntity,(__gnu_cxx::_Lock_policy)2> *)&issue,
                     (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)this);
          flattenComponentImports((ComponentEntityPtr *)&issue,(ComponentPtr *)&u,componentIndex);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          componentIndex = componentIndex + 1;
        }
      }
      Model::linkUnits((Model *)(this->super_Logger)._vptr_Logger);
      _Var6._M_pi = extraout_RDX_01;
      goto LAB_001f20be;
    }
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_UNDEFINED_MODEL);
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&u,"The model is not fully defined.",&local_69);
    Issue::IssueImpl::setDescription(pIVar1,(string *)&u);
    std::__cxx11::string::~string((string *)&u);
    pLVar3 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar3,&issue);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var6._M_pi = extraout_RDX_00;
LAB_001f20be:
  MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::flattenModel(const ModelPtr &model)
{
    pFunc()->removeAllIssues();
    ModelPtr flatModel;
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::INVALID_ARGUMENT);
        issue->mPimpl->setDescription("The model is null.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    if (pFunc()->hasImportIssues(model)) {
        return flatModel;
    }

    if (!model->isDefined()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_UNDEFINED_MODEL);
        issue->mPimpl->setDescription("The model is not fully defined.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    flatModel = model->clone();

    while (flatModel->hasImports()) {
        // Go through Units and instantiate any imported Units.
        for (size_t index = 0; index < flatModel->unitsCount(); ++index) {
            auto u = flatModel->units(index);
            if (u->isImport()) {
                flattenUnitsImports(flatModel, u, index, nullptr);
            }
        }

        // Go through Components and instantiate any imported Components.
        for (size_t index = 0; index < flatModel->componentCount(); ++index) {
            auto c = flatModel->component(index);
            flattenComponentImports(flatModel, c, index);
        }
    }

    flatModel->linkUnits();

    return flatModel;
}